

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int spyParamTest(void)

{
  Hook *pHVar1;
  HookArena arena;
  
  axl::spy::HookArena::HookArena(&arena);
  pHVar1 = axl::spy::HookArena::allocate
                     (&arena,spy_param_test::foo,(void *)0xabcdef,spy_param_test::fooHookEnter,
                      spy_param_test::fooHookLeave);
  (*(code *)pHVar1)(0x4024333333333333,0x4034333333333333,0x403e4ccccccccccd,0x4044333333333333,
                    0x4049400000000000,0x404e4ccccccccccd,0x4051accccccccccd,0x4054333333333333,1,2,
                    3,4,5,6,7,8,9,0x4056b9999999999a);
  axl::spy::HookArena::~HookArena(&arena);
  return 0;
}

Assistant:

int
spyParamTest() {
	typedef int FooFunc(
		int, double,
		int, double,
		int, double,
		int, double,
		int, double,
		int, double,
		int, double,
		int, double,
		int, double
	);

	spy::HookArena arena;

	spy::Hook* fooHook = arena.allocate(
		(void*)spy_param_test::foo,
		(void*)0xabcdef,
		spy_param_test::fooHookEnter,
		spy_param_test::fooHookLeave
	);

	((FooFunc*)fooHook)(
		1, 10.1,
		2, 20.2,
		3, 30.3,
		4, 40.4,
		5, 50.5,
		6, 60.6,
		7, 70.7,
		8, 80.8,
		9, 90.9
	);

	return 0;
}